

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitAtomicWait
          (Flow *__return_storage_ptr__,
          ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *this,AtomicWait *curr)

{
  Name memoryName;
  Name memory;
  undefined1 this_00 [8];
  char *curr_00;
  bool bVar1;
  byte bVar2;
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *pEVar3;
  Address memorySize_00;
  Literal *pLVar4;
  long lVar5;
  Literal local_1f0;
  Literal local_1d8;
  address64_t local_1c0;
  EvallingModuleRunner *local_1b8;
  size_t sStack_1b0;
  uintptr_t local_1a8;
  address64_t local_1a0;
  undefined1 local_198 [8];
  Literal loaded;
  Literal local_178;
  Address local_160;
  Address addr;
  Address memorySize;
  undefined1 local_128 [8];
  MemoryInstanceInfo info;
  undefined1 local_108 [4];
  uint bytes;
  Flow timeout;
  Flow expected;
  undefined1 local_68 [8];
  Flow ptr;
  AtomicWait *curr_local;
  ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *this_local;
  
  ptr.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar3 = (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)self(this);
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
            ((Flow *)local_68,pEVar3,*(Expression **)(ptr.breakTo.super_IString.str._M_str + 0x18));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar3 = (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)self(this);
    ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
              ((Flow *)&timeout.breakTo.super_IString.str._M_str,pEVar3,
               *(Expression **)(ptr.breakTo.super_IString.str._M_str + 0x20));
    bVar1 = Flow::breaking((Flow *)&timeout.breakTo.super_IString.str._M_str);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&timeout.breakTo.super_IString.str._M_str);
    }
    else {
      pEVar3 = (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)self(this);
      ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
                ((Flow *)local_108,pEVar3,
                 *(Expression **)(ptr.breakTo.super_IString.str._M_str + 0x28));
      bVar1 = Flow::breaking((Flow *)local_108);
      if (bVar1) {
        Flow::Flow(__return_storage_ptr__,(Flow *)local_108);
      }
      else {
        info.name.super_IString.str._M_str._4_4_ = ::wasm::Type::getByteSize();
        getMemoryInstanceInfo
                  ((MemoryInstanceInfo *)local_128,this,
                   (Name)((IString *)(ptr.breakTo.super_IString.str._M_str + 0x38))->str);
        addr.addr = (address64_t)info.instance;
        memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
        memory.super_IString.str._M_len = (size_t)info.instance;
        memorySize_00 =
             getMemorySize((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                           local_128,memory);
        curr_00 = ptr.breakTo.super_IString.str._M_str;
        this_00 = local_128;
        pLVar4 = Flow::getSingleValue((Flow *)local_68);
        ::wasm::Literal::Literal(&local_178,pLVar4);
        loaded.type.id = (uintptr_t)memorySize_00;
        local_160 = getFinalAddress<wasm::AtomicWait>
                              ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                               this_00,(AtomicWait *)curr_00,&local_178,
                               info.name.super_IString.str._M_str._4_4_,memorySize_00);
        ::wasm::Literal::~Literal(&local_178);
        local_1a0 = local_160.addr;
        local_1a8 = *(uintptr_t *)(ptr.breakTo.super_IString.str._M_str + 0x30);
        local_1b8 = info.instance;
        sStack_1b0 = info.name.super_IString.str._M_len;
        memoryName.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
        memoryName.super_IString.str._M_len = (size_t)info.instance;
        local_1c0 = memorySize_00.addr;
        doAtomicLoad((Literal *)local_198,
                     (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)local_128,
                     local_160,info.name.super_IString.str._M_str._4_4_,(Type)local_1a8,memoryName,
                     memorySize_00);
        pLVar4 = Flow::getSingleValue((Flow *)&timeout.breakTo.super_IString.str._M_str);
        bVar2 = ::wasm::Literal::operator!=((Literal *)local_198,pLVar4);
        if ((bVar2 & 1) == 0) {
          Flow::getSingleValue((Flow *)local_108);
          lVar5 = ::wasm::Literal::getInteger();
          if (lVar5 != 0) {
            (*(this->super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>).
              _vptr_ExpressionRunner[3])(this,"threads support");
          }
          wasm::Literal::Literal(&local_1f0,2);
          Flow::Flow(__return_storage_ptr__,&local_1f0);
          ::wasm::Literal::~Literal(&local_1f0);
        }
        else {
          wasm::Literal::Literal(&local_1d8,1);
          Flow::Flow(__return_storage_ptr__,&local_1d8);
          ::wasm::Literal::~Literal(&local_1d8);
        }
        ::wasm::Literal::~Literal((Literal *)local_198);
      }
      Flow::~Flow((Flow *)local_108);
    }
    Flow::~Flow((Flow *)&timeout.breakTo.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitAtomicWait(AtomicWait* curr) {
    NOTE_ENTER("AtomicWait");
    Flow ptr = self()->visit(curr->ptr);
    if (ptr.breaking()) {
      return ptr;
    }
    NOTE_EVAL1(ptr);
    auto expected = self()->visit(curr->expected);
    NOTE_EVAL1(expected);
    if (expected.breaking()) {
      return expected;
    }
    auto timeout = self()->visit(curr->timeout);
    NOTE_EVAL1(timeout);
    if (timeout.breaking()) {
      return timeout;
    }
    auto bytes = curr->expectedType.getByteSize();
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto addr = info.instance->getFinalAddress(
      curr, ptr.getSingleValue(), bytes, memorySize);
    auto loaded = info.instance->doAtomicLoad(
      addr, bytes, curr->expectedType, info.name, memorySize);
    NOTE_EVAL1(loaded);
    if (loaded != expected.getSingleValue()) {
      return Literal(int32_t(1)); // not equal
    }
    // TODO: Add threads support. For now, report a host limit here, as there
    //       are no other threads that can wake us up. Without such threads,
    //       we'd hang if there is no timeout, and even if there is a timeout
    //       then we can hang for a long time if it is in a loop. The only
    //       timeout value we allow here for now is 0.
    if (timeout.getSingleValue().getInteger() != 0) {
      hostLimit("threads support");
    }
    return Literal(int32_t(2)); // Timed out
  }